

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O3

int material_lookup(char *name)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *bstr;
  int iVar5;
  material_type *pmVar6;
  
  bstr = "none";
  pmVar6 = material_table;
  iVar4 = 0;
  while( true ) {
    pmVar6 = pmVar6 + 1;
    cVar1 = *name;
    iVar3 = cVar1 + 0x20;
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      iVar3 = (int)cVar1;
    }
    cVar1 = *bstr;
    iVar5 = cVar1 + 0x20;
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      iVar5 = (int)cVar1;
    }
    if ((iVar3 == iVar5) && (bVar2 = str_prefix(name,bstr), !bVar2)) break;
    bstr = pmVar6->mat_name;
    iVar4 = iVar4 + 1;
    if (bstr == (char *)0x0) {
      return -1;
    }
  }
  return iVar4;
}

Assistant:

int material_lookup(const char *name)
{
	int flag;

	for (flag = 0; material_table[flag].mat_name != nullptr; flag++)
	{
		if (LOWER(name[0]) == LOWER(material_table[flag].mat_name[0]) && !str_prefix(name, material_table[flag].mat_name))
			return flag;
	}

	return -1;
}